

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O3

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
::
nosize_unchecked_emplace_at<std::pair<slang::ast::Symbol_const*&&,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>&&>>
          (locator *__return_storage_ptr__,
          table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
          *this,arrays_type *arrays_,size_t pos0,size_t hash,
          pair<const_slang::ast::Symbol_*&&,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_&&>
          *args)

{
  group_type_pointer pgVar1;
  value_type_pointer ppVar2;
  group_type_pointer pgVar3;
  tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext> *ptVar4;
  ulong uVar5;
  uint uVar6;
  ushort uVar7;
  Scope *pSVar8;
  underlying_type uVar9;
  Symbol *pSVar10;
  RandomizeDetails *pRVar11;
  _Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext> *p_Var12;
  SymbolIndex SVar13;
  undefined4 uVar14;
  long lVar15;
  long lVar16;
  uint uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  
  pgVar3 = arrays_->groups_;
  lVar15 = pos0 * 0x10;
  pgVar1 = pgVar3 + pos0;
  auVar18[0] = -(pgVar1->m[0].n == '\0');
  auVar18[1] = -(pgVar1->m[1].n == '\0');
  auVar18[2] = -(pgVar1->m[2].n == '\0');
  auVar18[3] = -(pgVar1->m[3].n == '\0');
  auVar18[4] = -(pgVar1->m[4].n == '\0');
  auVar18[5] = -(pgVar1->m[5].n == '\0');
  auVar18[6] = -(pgVar1->m[6].n == '\0');
  auVar18[7] = -(pgVar1->m[7].n == '\0');
  auVar18[8] = -(pgVar1->m[8].n == '\0');
  auVar18[9] = -(pgVar1->m[9].n == '\0');
  auVar18[10] = -(pgVar1->m[10].n == '\0');
  auVar18[0xb] = -(pgVar1->m[0xb].n == '\0');
  auVar18[0xc] = -(pgVar1->m[0xc].n == '\0');
  auVar18[0xd] = -(pgVar1->m[0xd].n == '\0');
  auVar18[0xe] = -(pgVar1->m[0xe].n == '\0');
  auVar18[0xf] = -(pgVar1->m[0xf].n == '\0');
  uVar17 = (uint)(ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe);
  if (uVar17 == 0) {
    uVar5 = arrays_->groups_size_mask;
    lVar16 = 1;
    do {
      pgVar3[pos0].m[0xf].n = pgVar3[pos0].m[0xf].n | '\x01' << ((byte)hash & 7);
      pos0 = pos0 + lVar16 & uVar5;
      lVar15 = pos0 * 0x10;
      pgVar1 = pgVar3 + pos0;
      auVar19[0] = -(pgVar1->m[0].n == '\0');
      auVar19[1] = -(pgVar1->m[1].n == '\0');
      auVar19[2] = -(pgVar1->m[2].n == '\0');
      auVar19[3] = -(pgVar1->m[3].n == '\0');
      auVar19[4] = -(pgVar1->m[4].n == '\0');
      auVar19[5] = -(pgVar1->m[5].n == '\0');
      auVar19[6] = -(pgVar1->m[6].n == '\0');
      auVar19[7] = -(pgVar1->m[7].n == '\0');
      auVar19[8] = -(pgVar1->m[8].n == '\0');
      auVar19[9] = -(pgVar1->m[9].n == '\0');
      auVar19[10] = -(pgVar1->m[10].n == '\0');
      auVar19[0xb] = -(pgVar1->m[0xb].n == '\0');
      auVar19[0xc] = -(pgVar1->m[0xc].n == '\0');
      auVar19[0xd] = -(pgVar1->m[0xd].n == '\0');
      auVar19[0xe] = -(pgVar1->m[0xe].n == '\0');
      auVar19[0xf] = -(pgVar1->m[0xf].n == '\0');
      uVar7 = (ushort)(SUB161(auVar19 >> 7,0) & 1) | (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe;
      uVar17 = (uint)uVar7;
      lVar16 = lVar16 + 1;
    } while (uVar7 == 0);
  }
  uVar6 = 0;
  if (uVar17 != 0) {
    for (; (uVar17 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
    }
  }
  ppVar2 = arrays_->elements_ + pos0 * 0xf + (ulong)uVar6;
  ppVar2->first = *args->first;
  ptVar4 = args->second;
  (ppVar2->second).
  super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
  super__Tuple_impl<1UL,_slang::ast::ASTContext>.
  super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.assertionInstance =
       (ptVar4->
       super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>).
       super__Tuple_impl<1UL,_slang::ast::ASTContext>.
       super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.assertionInstance;
  pSVar8 = (ptVar4->
           super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
           ).super__Tuple_impl<1UL,_slang::ast::ASTContext>.
           super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.scope.ptr;
  SVar13 = (ptVar4->
           super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
           ).super__Tuple_impl<1UL,_slang::ast::ASTContext>.
           super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.lookupIndex;
  uVar14 = *(undefined4 *)
            &(ptVar4->
             super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
             ).super__Tuple_impl<1UL,_slang::ast::ASTContext>.
             super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.field_0xc;
  uVar9 = (ptVar4->
          super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>)
          .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
          super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.flags.m_bits;
  pSVar10 = (ptVar4->
            super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
            ).super__Tuple_impl<1UL,_slang::ast::ASTContext>.
            super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.instanceOrProc;
  pRVar11 = (ptVar4->
            super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
            ).super__Tuple_impl<1UL,_slang::ast::ASTContext>.
            super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.randomizeDetails;
  (ppVar2->second).
  super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
  super__Tuple_impl<1UL,_slang::ast::ASTContext>.
  super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.firstTempVar =
       (ptVar4->
       super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>).
       super__Tuple_impl<1UL,_slang::ast::ASTContext>.
       super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.firstTempVar;
  (ppVar2->second).
  super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
  super__Tuple_impl<1UL,_slang::ast::ASTContext>.
  super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.randomizeDetails = pRVar11;
  (ppVar2->second).
  super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
  super__Tuple_impl<1UL,_slang::ast::ASTContext>.
  super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.flags.m_bits = uVar9;
  (ppVar2->second).
  super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
  super__Tuple_impl<1UL,_slang::ast::ASTContext>.
  super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.instanceOrProc = pSVar10;
  (ppVar2->second).
  super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
  super__Tuple_impl<1UL,_slang::ast::ASTContext>.
  super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.scope.ptr = pSVar8;
  p_Var12 = &(ppVar2->second).
             super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
  ;
  (p_Var12->super__Tuple_impl<1UL,_slang::ast::ASTContext>).
  super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.lookupIndex = SVar13;
  *(undefined4 *)
   &(p_Var12->super__Tuple_impl<1UL,_slang::ast::ASTContext>).
    super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.field_0xc = uVar14;
  (ppVar2->second).
  super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
  super__Head_base<0UL,_const_slang::syntax::PropertyExprSyntax_*,_false>._M_head_impl =
       (ptVar4->
       super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>).
       super__Head_base<0UL,_const_slang::syntax::PropertyExprSyntax_*,_false>._M_head_impl;
  (pgVar3->m + lVar15)[uVar6].n =
       *(uchar *)(&group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                   ::word + (hash & 0xff));
  __return_storage_ptr__->pg =
       (group15<boost::unordered::detail::foa::plain_integral> *)(pgVar3->m + lVar15);
  __return_storage_ptr__->n = uVar6;
  __return_storage_ptr__->p = ppVar2;
  return __return_storage_ptr__;
}

Assistant:

locator nosize_unchecked_emplace_at(const arrays_type& arrays_, std::size_t pos0,
                                        std::size_t hash, Args&&... args) {
        for (prober pb(pos0);; pb.next(arrays_.groups_size_mask)) {
            auto pos = pb.get();
            auto pg = arrays_.groups() + pos;
            auto mask = pg->match_available();
            if (BOOST_LIKELY(mask != 0)) {
                auto n = unchecked_countr_zero(mask);
                auto p = arrays_.elements() + pos * N + n;
                construct_element(p, std::forward<Args>(args)...);
                pg->set(n, hash);
                BOOST_UNORDERED_ADD_STATS(cstats.insertion, (pb.length()));
                return {pg, n, p};
            }
            else
                pg->mark_overflow(hash);
        }
    }